

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O1

int run_test_barrier_1(void)

{
  int iVar1;
  uv_barrier_t *barrier;
  uv_thread_t thread;
  worker_config wc;
  undefined1 local_40 [32];
  undefined8 uStack_20;
  undefined8 local_18;
  uint uStack_10;
  uint uStack_c;
  
  barrier = (uv_barrier_t *)(local_40 + 8);
  local_18 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_40._24_8_ = 0;
  uStack_20 = 0;
  local_40._8_8_ = 0;
  local_40._16_8_ = 0;
  iVar1 = uv_barrier_init(barrier,2);
  if (iVar1 == 0) {
    barrier = (uv_barrier_t *)local_40;
    iVar1 = uv_thread_create((uv_thread_t *)&barrier->__align,worker,local_40 + 8);
    if (iVar1 != 0) goto LAB_00149dc5;
    uv_sleep(100);
    uStack_10 = uv_barrier_wait((uv_barrier_t *)(local_40 + 8));
    barrier = (uv_barrier_t *)local_40;
    iVar1 = uv_thread_join((uv_thread_t *)&barrier->__align);
    if (iVar1 == 0) {
      barrier = (uv_barrier_t *)(local_40 + 8);
      uv_barrier_destroy(barrier);
      if ((uStack_c ^ uStack_10) == 1) {
        return 0;
      }
      goto LAB_00149dcf;
    }
  }
  else {
    run_test_barrier_1_cold_1();
LAB_00149dc5:
    run_test_barrier_1_cold_2();
  }
  run_test_barrier_1_cold_3();
LAB_00149dcf:
  run_test_barrier_1_cold_4();
  if (*(uint *)(barrier + 1) != 0) {
    uv_sleep(*(uint *)(barrier + 1));
  }
  iVar1 = uv_barrier_wait(barrier);
  *(int *)((long)barrier + 0x2c) = iVar1;
  return iVar1;
}

Assistant:

TEST_IMPL(barrier_1) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sleep(100);
  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}